

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

bool __thiscall TSMuxer::muxPacket(TSMuxer *this,AVPacket *avPacket)

{
  _func_int **pp_Var1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  reference plVar7;
  size_type sVar8;
  reference pvVar9;
  mapped_type_conflict2 *pmVar10;
  ostream *this_00;
  VodCoreException *this_01;
  mapped_type *pmVar11;
  byte *pbVar12;
  int iVar13;
  double dVar14;
  MPEGStreamReader *local_2e8;
  longlong local_2c8;
  _func_int **local_270;
  uint8_t *local_260;
  MPEGStreamReader *local_258;
  MPEGStreamReader *mpegReader;
  uint8_t pesStreamID;
  longlong cbrPCR;
  long lStack_220;
  bool newPES;
  int64_t newPCR;
  string local_210;
  ostringstream local_1e0 [8];
  ostringstream ss;
  int local_64;
  int64_t iStack_60;
  int tsIndex;
  int64_t firstPtsShift;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  MPEGStreamReader *local_28;
  MPEGStreamReader *mpegReader_1;
  AVPacket *avPacket_local;
  TSMuxer *this_local;
  
  if ((avPacket->data != (uint8_t *)0x0) && (avPacket->size != 0)) {
    mpegReader_1 = (MPEGStreamReader *)avPacket;
    avPacket_local = (AVPacket *)this;
    if (avPacket->stream_index == this->m_mainStreamIndex) {
      if (avPacket->codec == (BaseAbstractStreamReader *)0x0) {
        local_258 = (MPEGStreamReader *)0x0;
      }
      else {
        local_258 = (MPEGStreamReader *)
                    __dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                                   &MPEGStreamReader::typeinfo,0);
      }
      local_28 = local_258;
      if (local_258 != (MPEGStreamReader *)0x0) {
        dVar14 = MPEGStreamReader::getFPS(local_258);
        this->m_additionCLPISize = (long)(5292000000.0 / dVar14);
      }
      if ((long)(mpegReader_1->super_AbstractStreamReader).m_bufEnd < 1) {
        std::vector<long,_std::allocator<long>_>::rbegin
                  ((vector<long,_std::allocator<long>_> *)(local_50 + 8));
        plVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)(local_50 + 8));
        if ((long)(mpegReader_1->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader < *plVar7) {
          std::vector<long,_std::allocator<long>_>::rbegin
                    ((vector<long,_std::allocator<long>_> *)local_50);
          plVar7 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                                *)local_50);
          local_270 = (_func_int **)*plVar7;
        }
        else {
          local_270 = (mpegReader_1->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                      _vptr_BaseAbstractStreamReader;
        }
        std::vector<long,_std::allocator<long>_>::rbegin
                  ((vector<long,_std::allocator<long>_> *)&firstPtsShift);
        plVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)&firstPtsShift);
        *plVar7 = (long)local_270;
      }
      else {
        std::vector<long,_std::allocator<long>_>::rbegin
                  ((vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0);
        plVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)&stack0xffffffffffffffd0);
        if ((long)((mpegReader_1->super_AbstractStreamReader).m_bufEnd +
                  (long)(mpegReader_1->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                        _vptr_BaseAbstractStreamReader) < *plVar7) {
          std::vector<long,_std::allocator<long>_>::rbegin
                    ((vector<long,_std::allocator<long>_> *)(local_40 + 8));
          plVar7 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                                *)(local_40 + 8));
          local_260 = (uint8_t *)*plVar7;
        }
        else {
          local_260 = (mpegReader_1->super_AbstractStreamReader).m_bufEnd +
                      (long)(mpegReader_1->super_AbstractStreamReader).
                            super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader;
        }
        std::vector<long,_std::allocator<long>_>::rbegin
                  ((vector<long,_std::allocator<long>_> *)local_40);
        plVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)local_40);
        *plVar7 = (long)local_260;
      }
    }
    sVar8 = std::vector<long,_std::allocator<long>_>::size(&this->m_firstPts);
    pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](&this->m_firstPts,sVar8 - 1);
    if (*pvVar9 == -1) {
      sVar8 = std::vector<long,_std::allocator<long>_>::size(&this->m_firstPts);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](&this->m_firstPts,sVar8 - 1);
      if (*pvVar9 == -1) {
        this->m_curFileStartPts =
             (int64_t)(mpegReader_1->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                      _vptr_BaseAbstractStreamReader;
        iStack_60 = internalClockToPts((int64_t)(mpegReader_1->super_AbstractStreamReader).
                                                super_BaseAbstractStreamReader.
                                                _vptr_BaseAbstractStreamReader);
        this->m_fixed_pcr_offset = (this->m_timeOffset - this->m_vbvLen) + iStack_60;
        if (this->m_fixed_pcr_offset < 0) {
          this->m_fixed_pcr_offset = 0;
        }
        this->m_prevM2TSPCR = (this->m_fixed_pcr_offset + -100) * 300;
      }
      pp_Var1 = (mpegReader_1->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader;
      sVar8 = std::vector<long,_std::allocator<long>_>::size(&this->m_firstPts);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](&this->m_firstPts,sVar8 - 1);
      *pvVar9 = (value_type)pp_Var1;
    }
    if (this->m_pcr_delta == -1) {
      if (this->m_cbrBitrate == -1) {
        this->m_pcr_delta = 7000;
      }
      else {
        this->m_pcr_delta = 7000;
      }
      iVar13 = 0x57e4;
      if ((this->m_m2tsMode & 1U) != 0) {
        iVar13 = 7000;
      }
      this->m_patPmtDelta = iVar13;
    }
    if (this->m_minDts == -1) {
      this->m_minDts = *(int64_t *)&(mpegReader_1->super_AbstractStreamReader).m_flags;
    }
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](&this->m_extIndexToTSIndex,
                         (key_type_conflict *)
                         ((long)&(mpegReader_1->super_AbstractStreamReader).m_buffer + 4));
    local_64 = *pmVar10;
    if (local_64 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1e0);
      this_00 = std::operator<<((ostream *)local_1e0,"Unknown track number ");
      std::ostream::operator<<
                (this_00,*(int *)((long)&(mpegReader_1->super_AbstractStreamReader).m_buffer + 4));
      this_01 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_01,200,&local_210);
      __cxa_throw(this_01,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    lStack_220 = (*(long *)&(mpegReader_1->super_AbstractStreamReader).m_flags - this->m_minDts) /
                 0xe5b0 + this->m_fixed_pcr_offset;
    if (this->m_lastPCR == -1) {
      writePATPMT(this,lStack_220,true);
      writePCR(this,lStack_220);
    }
    bVar6 = false;
    lVar4._0_4_ = (mpegReader_1->super_AbstractStreamReader).m_flags;
    lVar4._4_4_ = (mpegReader_1->super_AbstractStreamReader).m_containerType;
    pmVar11 = std::
              map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
              ::operator[](&this->m_streamInfo,&local_64);
    if ((((lVar4 != pmVar11->m_dts) ||
         (pp_Var1 = (mpegReader_1->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                    _vptr_BaseAbstractStreamReader,
         pmVar11 = std::
                   map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
                   ::operator[](&this->m_streamInfo,&local_64),
         pp_Var1 != (_func_int **)pmVar11->m_pts)) || (local_64 != this->m_lastTSIndex)) ||
       (((ulong)(mpegReader_1->super_AbstractStreamReader).m_curPos & 4) != 0)) {
      writePESPacket(this);
      bVar6 = true;
    }
    this->m_lastTSIndex = local_64;
    if ((this->m_cbrBitrate != -1) && (this->m_lastPCR != -1)) {
      local_2c8 = llround(((double)(this->m_lastPCR + (long)this->m_pcrBits) * 90000.0) /
                          (double)this->m_cbrBitrate);
      if (local_2c8 < lStack_220) {
        local_2c8 = lStack_220;
      }
      lStack_220 = local_2c8;
    }
    if (((bVar6) && ((this->m_canSwithBlock & 1U) != 0)) &&
       (bVar5 = isSplitPoint(this,(AVPacket *)mpegReader_1), bVar5)) {
      finishFileBlock(this,(int64_t)(mpegReader_1->super_AbstractStreamReader).
                                    super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader,
                      lStack_220,true,true);
    }
    else if ((((bVar6) && (0 < (this->super_AbstractMuxer).m_interliaveBlockSize)) &&
             ((this->m_canSwithBlock & 1U) != 0)) &&
            ((bVar6 = blockFull(this), bVar6 ||
             ((this->m_sublingMuxer != (TSMuxer *)0x0 &&
              (bVar6 = blockFull(this->m_sublingMuxer), bVar6)))))) {
      finishFileBlock(this,(int64_t)(mpegReader_1->super_AbstractStreamReader).
                                    super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader,
                      lStack_220,false,true);
    }
    else if (((long)this->m_pcr_delta <= lStack_220 - this->m_lastPCR) &&
            (((this->super_AbstractMuxer).m_interliaveBlockSize == 0 ||
             (*(int *)((long)&(mpegReader_1->super_AbstractStreamReader).m_buffer + 4) ==
              this->m_mainStreamIndex)))) {
      writePATPMT(this,lStack_220,false);
      writePCR(this,lStack_220);
    }
    pp_Var1 = (mpegReader_1->super_AbstractStreamReader).super_BaseAbstractStreamReader.
              _vptr_BaseAbstractStreamReader;
    pmVar11 = std::
              map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
              ::operator[](&this->m_streamInfo,&local_64);
    pmVar11->m_pts = (int64_t)pp_Var1;
    iVar2 = *(int64_t *)&(mpegReader_1->super_AbstractStreamReader).m_flags;
    pmVar11 = std::
              map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
              ::operator[](&this->m_streamInfo,&local_64);
    pmVar11->m_dts = iVar2;
    pbVar12 = std::
              map<int,_unsigned_char,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>
              ::operator[](&this->m_pesType,&local_64);
    mpegReader._7_1_ = *pbVar12;
    if (mpegReader._7_1_ < 0xba) {
      if ((this->m_useNewStyleAudioPES & 1U) == 0) {
        mpegReader._7_1_ = 0xbd;
      }
      else {
        mpegReader._7_1_ = 0xfd;
      }
    }
    addData(this,mpegReader._7_1_,local_64,(AVPacket *)mpegReader_1);
    lVar3._0_1_ = (mpegReader_1->super_AbstractStreamReader).m_demuxMode;
    lVar3._1_1_ = (mpegReader_1->super_AbstractStreamReader).m_secondary;
    lVar3._2_2_ = *(undefined2 *)&(mpegReader_1->super_AbstractStreamReader).field_0x42;
    lVar3._4_4_ = (mpegReader_1->super_AbstractStreamReader).m_pipParams.scaleIndex;
    if (lVar3 == 0) {
      local_2e8 = (MPEGStreamReader *)0x0;
    }
    else {
      local_2e8 = (MPEGStreamReader *)
                  __dynamic_cast(lVar3,&BaseAbstractStreamReader::typeinfo,
                                 &MPEGStreamReader::typeinfo,0);
    }
    if ((long)(mpegReader_1->super_AbstractStreamReader).m_bufEnd < 1) {
      if (local_2e8 == (MPEGStreamReader *)0x0) {
        this->m_endStreamDTS = *(int64_t *)&(mpegReader_1->super_AbstractStreamReader).m_flags;
      }
      else {
        lVar4 = *(long *)&(mpegReader_1->super_AbstractStreamReader).m_flags;
        dVar14 = MPEGStreamReader::getFPS(local_2e8);
        this->m_endStreamDTS = lVar4 + (long)(5292000000.0 / dVar14);
      }
    }
    else {
      this->m_endStreamDTS =
           (int64_t)((mpegReader_1->super_AbstractStreamReader).m_bufEnd +
                    *(long *)&(mpegReader_1->super_AbstractStreamReader).m_flags);
    }
  }
  return true;
}

Assistant:

bool TSMuxer::muxPacket(AVPacket& avPacket)
{
    if (avPacket.data == nullptr || avPacket.size == 0)
    {
        return true;
    }

#ifdef _DEBUG
    // assert (avPacket.dts >= m_lastProcessedDts);
    m_lastProcessedDts = avPacket.dts;
    m_lastStreamIndex = avPacket.stream_index;
#endif

    if (avPacket.stream_index == m_mainStreamIndex)
    {
        const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
        if (mpegReader)
            m_additionCLPISize = static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());

        if (avPacket.duration > 0)
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts + avPacket.duration);
        else
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts);
    }
    if (m_firstPts[m_firstPts.size() - 1] == -1 /*|| avPacket.pts < m_firstPts[m_firstPts.size()-1]*/)
    {
        if (m_firstPts[m_firstPts.size() - 1] == -1)
        {
            m_curFileStartPts = avPacket.pts;
            const int64_t firstPtsShift = internalClockToPts(avPacket.pts);
            m_fixed_pcr_offset = m_timeOffset - m_vbvLen + firstPtsShift;
            if (m_fixed_pcr_offset < 0)
                m_fixed_pcr_offset = 0;
            m_prevM2TSPCR = (m_fixed_pcr_offset - 100) *
                            300;  // add a little extra delta (100) to prevent 0 bitrate for first several packets
        }
        m_firstPts[m_firstPts.size() - 1] = avPacket.pts;
    }

    if (m_pcr_delta == -1)
    {
        if (m_cbrBitrate != -1)
            m_pcr_delta = M_CBR_PCR_DELTA;
        else
            m_pcr_delta = M_PCR_DELTA;
        m_patPmtDelta = m_m2tsMode ? M_PCR_DELTA : PCR_FREQUENCY / 4;
    }

    if (m_minDts == -1)
        m_minDts = avPacket.dts;

    const int tsIndex = m_extIndexToTSIndex[avPacket.stream_index];
    if (tsIndex == 0)
        THROW(ERR_TS_COMMON, "Unknown track number " << avPacket.stream_index)

    auto newPCR = (avPacket.dts - m_minDts) / INT_FREQ_TO_TS_FREQ + m_fixed_pcr_offset;
    if (m_lastPCR == -1)
    {
        writePATPMT(newPCR, true);
        writePCR(newPCR);
    }

    bool newPES = false;
    if (avPacket.dts != m_streamInfo[tsIndex].m_dts || avPacket.pts != m_streamInfo[tsIndex].m_pts ||
        tsIndex != m_lastTSIndex || avPacket.flags & AVPacket::FORCE_NEW_FRAME)
    {
        writePESPacket();
        newPES = true;
    }

    m_lastTSIndex = tsIndex;

    if (m_cbrBitrate != -1 && m_lastPCR != -1)
    {
        const auto cbrPCR = llround(static_cast<double>(m_lastPCR + m_pcrBits) * 90000.0 / m_cbrBitrate);
        newPCR = FFMAX(newPCR, cbrPCR);
    }

    if (newPES && m_canSwithBlock && isSplitPoint(avPacket))
    {
        finishFileBlock(avPacket.pts, newPCR, true);  // goto next file
    }
    else if (newPES && m_interliaveBlockSize > 0 && m_canSwithBlock &&
             (blockFull() || (m_sublingMuxer && m_sublingMuxer->blockFull())))
    {
        finishFileBlock(avPacket.pts, newPCR, false);  // interleave SSIF here
    }
    else if (newPCR - m_lastPCR >= m_pcr_delta)
    {
        if (m_interliaveBlockSize == 0 || avPacket.stream_index == m_mainStreamIndex)
        {
            writePATPMT(newPCR);
            writePCR(newPCR);
        }
    }

    m_streamInfo[tsIndex].m_pts = avPacket.pts;
    m_streamInfo[tsIndex].m_dts = avPacket.dts;
    uint8_t pesStreamID = m_pesType[tsIndex];
    if (pesStreamID <= SYSTEM_START_CODE)
    {
        if (m_useNewStyleAudioPES)
            pesStreamID = PES_VC1_ID;
        else
            pesStreamID = PES_PRIVATE_DATA1;
    }

    addData(pesStreamID, tsIndex, avPacket);

    const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
    if (avPacket.duration > 0)
        m_endStreamDTS = avPacket.dts + avPacket.duration;
    else if (mpegReader)
        m_endStreamDTS = avPacket.dts + static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());
    else
        m_endStreamDTS = avPacket.dts;

    return true;
}